

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

prevector<8U,_int,_unsigned_int,_int> * __thiscall
prevector<8U,_int,_unsigned_int,_int>::operator=
          (prevector<8U,_int,_unsigned_int,_int> *this,prevector<8U,_int,_unsigned_int,_int> *other)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_type sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (8 < this->_size) {
    free((this->_union).indirect_contents.indirect);
  }
  uVar2 = *(undefined4 *)&other->_union;
  uVar3 = *(undefined4 *)((long)&other->_union + 4);
  sVar4 = (other->_union).indirect_contents.capacity;
  uVar5 = *(undefined4 *)((long)&other->_union + 0xc);
  uVar6 = *(undefined4 *)((long)&other->_union + 0x14);
  uVar7 = *(undefined4 *)((long)&other->_union + 0x18);
  uVar8 = *(undefined4 *)((long)&other->_union + 0x1c);
  *(undefined4 *)((long)&this->_union + 0x10) = *(undefined4 *)((long)&other->_union + 0x10);
  *(undefined4 *)((long)&this->_union + 0x14) = uVar6;
  *(undefined4 *)((long)&this->_union + 0x18) = uVar7;
  *(undefined4 *)((long)&this->_union + 0x1c) = uVar8;
  *(undefined4 *)&this->_union = uVar2;
  *(undefined4 *)((long)&this->_union + 4) = uVar3;
  (this->_union).indirect_contents.capacity = sVar4;
  *(undefined4 *)((long)&this->_union + 0xc) = uVar5;
  this->_size = other->_size;
  other->_size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

prevector& operator=(prevector<N, T, Size, Diff>&& other) noexcept {
        if (!is_direct()) {
            free(_union.indirect_contents.indirect);
        }
        _union = std::move(other._union);
        _size = other._size;
        other._size = 0;
        return *this;
    }